

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileBuffer.cpp
# Opt level: O0

bufsize_t AbstractFileBuffer::dump(QString *path,AbstractByteBuffer *bBuf,bool allowExceptions)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FileBufferException *pFVar3;
  QString *pQVar4;
  bufsize_t wrote;
  QString local_a8;
  QString local_90;
  QFlags<QIODeviceBase::OpenModeFlag> local_74;
  QFile local_70 [8];
  QFile fOut;
  QString local_50;
  undefined8 local_38;
  bufsize_t bufSize;
  BYTE *buf;
  AbstractByteBuffer *pAStack_20;
  bool allowExceptions_local;
  AbstractByteBuffer *bBuf_local;
  QString *path_local;
  
  buf._7_1_ = allowExceptions;
  pAStack_20 = bBuf;
  bBuf_local = (AbstractByteBuffer *)path;
  iVar2 = (*bBuf->_vptr_AbstractByteBuffer[3])();
  bufSize = CONCAT44(extraout_var,iVar2);
  iVar2 = (*pAStack_20->_vptr_AbstractByteBuffer[2])();
  local_38 = CONCAT44(extraout_var_00,iVar2);
  if (bufSize == 0) {
    if ((buf._7_1_ & 1) != 0) {
      pFVar3 = (FileBufferException *)__cxa_allocate_exception(0x48);
      QString::QString(&local_50,"Buffer is empty");
      FileBufferException::FileBufferException(pFVar3,&local_50);
      __cxa_throw(pFVar3,&FileBufferException::typeinfo,FileBufferException::~FileBufferException);
    }
    path_local = (QString *)0x0;
  }
  else {
    QFile::QFile(local_70,(QString *)bBuf_local);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags(&local_74,WriteOnly);
    bVar1 = QFile::open((QFlags_conflict *)local_70);
    if ((bVar1 & 1) == 0) {
      if ((buf._7_1_ & 1) != 0) {
        pFVar3 = (FileBufferException *)__cxa_allocate_exception(0x48);
        operator+(&local_a8,"Cannot open the file: ",(QString *)bBuf_local);
        operator+(&local_90,&local_a8," for writing");
        FileBufferException::FileBufferException(pFVar3,&local_90);
        __cxa_throw(pFVar3,&FileBufferException::typeinfo,FileBufferException::~FileBufferException)
        ;
      }
      path_local = (QString *)0x0;
    }
    else {
      pQVar4 = (QString *)QIODevice::write((char *)local_70,bufSize);
      QFileDevice::close();
      path_local = pQVar4;
    }
    QFile::~QFile(local_70);
  }
  return (bufsize_t)path_local;
}

Assistant:

bufsize_t AbstractFileBuffer::dump(const QString &path, AbstractByteBuffer &bBuf, bool allowExceptions)
{
    BYTE* buf = bBuf.getContent();
    bufsize_t bufSize  = bBuf.getContentSize();
    if (buf == NULL) {
        if (allowExceptions) throw FileBufferException("Buffer is empty");
        return 0;
    }
    QFile fOut(path);
    if (fOut.open(QFile::WriteOnly) == false) {
        if (allowExceptions) throw FileBufferException("Cannot open the file: " + path + " for writing");
        return 0;
    }
    bufsize_t wrote = static_cast<bufsize_t> (fOut.write((char*)buf, bufSize));
    fOut.close();
    return wrote;
}